

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

void __thiscall
SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::ResetParse
          (Parse<SGParser::Generator::RegExprNFAParseElement> *this)

{
  uint uVar1;
  ParseTable *pPVar2;
  ulong uVar3;
  RegExprNFAParseElement *pRVar4;
  size_t *psVar5;
  size_t *psVar6;
  size_t markerIndex;
  
  pPVar2 = this->pParseTable;
  if ((pPVar2 == (ParseTable *)0x0) || (pPVar2->Type == None)) {
    psVar6 = (size_t *)0x0;
  }
  else {
    psVar6 = (size_t *)
             operator_new__(-(ulong)(pPVar2->ActionWidth >> 0x3d != 0) | pPVar2->ActionWidth << 3);
  }
  CleanupParseStack(this,0);
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ResetStream
            (&this->Stream,this->pTokenizer,1);
  this->StackPosition = 0;
  uVar3 = (this->Stream).ThisPos;
  if (uVar3 < 0x200) {
    markerIndex = uVar3 + ((this->Stream).pThisBlock)->Index;
    this->PrevTokenIndex = markerIndex;
    pPVar2 = this->pParseTable;
    if (((pPVar2 == (ParseTable *)0x0) ||
        (this->pTokenizer == (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0)) ||
       (pPVar2->Type == None)) {
      this->TopState = 0xffffffff;
      (this->pStack->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).State =
           0xffffffff;
    }
    else {
      uVar1 = pPVar2->InitialState;
      this->TopState = uVar1;
      pRVar4 = this->pStack;
      (pRVar4->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).State = uVar1;
      if ((ulong)uVar1 == 0xffffffff) {
        __assert_fail("TopState != InvalidState",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                      ,0x178,
                      "void SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::ResetParse()"
                     );
      }
      if (((byte)(pPVar2->StateInfos).
                 super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar1] & 1) == 0) {
        (pRVar4->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).TerminalMarker =
             0xffffffffffffffff;
      }
      else {
        (pRVar4->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).TerminalMarker =
             markerIndex;
        BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker
                  (&this->Stream,markerIndex);
      }
      psVar5 = this->pValidTokenStackPositions;
      this->pValidTokenStackPositions = psVar6;
      if (psVar5 != (size_t *)0x0) {
        operator_delete__(psVar5);
      }
    }
    this->NextTokenFlag = true;
    return;
  }
  __assert_fail("ThisPos < StreamBlock::BufferSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./BacktrackingTokenStream.h"
                ,0xd2,
                "size_t SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex() const [Token = SGParser::Generator::RegExprParseToken]"
               );
}

Assistant:

void Parse<StackElement>::ResetParse() {
    // Token set might have been a different size so it must be reallocated
    // Basic exception safety is provided
    size_t* newValidTokenSet = pParseTable && pParseTable->IsValid()
                                   ? new size_t[pParseTable->GetTerminalCount()]
                                   : nullptr;

    // From this point we can (safely) change the existing data

    // Delete the parse stack
    CleanupParseStack();
    Stream.ResetStream(pTokenizer);

    // Reset the data
    StackPosition  = 0u;
    PrevTokenIndex = Stream.GetTokenIndex();

    // If the parse table and tokenizer are valid then reinitialize the data
    if (pParseTable && pTokenizer && pParseTable->IsValid()) {
        // Set the top and stack state to the initial parse table state
        TopState         = pParseTable->GetInitialState();
        pStack[0u].State = TopState;
        SG_ASSERT(TopState != InvalidState);

        // If the state is recording then initialize the terminal marker
        if (pParseTable->StateInfos[TopState].Record)
            Stream.SetMarker(pStack[0u].TerminalMarker = Stream.GetTokenIndex());
        else
            pStack[0u].TerminalMarker = InvalidIndex;

        delete[] std::exchange(pValidTokenStackPositions, newValidTokenSet);
    }
    // Otherwise, set them to empty
    else {
        TopState         = InvalidState;
        pStack[0u].State = InvalidState;
    }

    NextTokenFlag = true;
}